

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O1

bool __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::evaluateExpression
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          QExpression *left,QExpression *right,QOperation oper)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  QExpression *pQVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  
  switch((int)CONCAT71(in_register_00000009,oper)) {
  case 1:
    if (left->Type == IntegerNumber) {
      bVar3 = 0 < (long)(left->field_0).SubExpressions.storage_;
    }
    else if (left->Type == NaturalNumber) {
      bVar3 = (left->field_0).SubExpressions.storage_ != (QExpression *)0x0;
    }
    else {
      bVar3 = 0.0 < *(double *)&left->field_0;
    }
    pQVar4 = (QExpression *)0x1;
    if (!bVar3) {
      if (right->Type == IntegerNumber) {
        bVar3 = 0 < (long)(right->field_0).SubExpressions.storage_;
      }
      else if (right->Type == NaturalNumber) {
        bVar3 = (right->field_0).SubExpressions.storage_ != (QExpression *)0x0;
      }
      else {
        bVar3 = 0.0 < *(double *)&right->field_0;
      }
      pQVar4 = (QExpression *)(ulong)bVar3;
    }
    (left->field_0).SubExpressions.storage_ = pQVar4;
    goto LAB_001156d7;
  case 2:
    if (left->Type == IntegerNumber) {
      bVar3 = 0 < (long)(left->field_0).SubExpressions.storage_;
    }
    else if (left->Type == NaturalNumber) {
      bVar3 = (left->field_0).SubExpressions.storage_ != (QExpression *)0x0;
    }
    else {
      bVar3 = 0.0 < *(double *)&left->field_0;
    }
    if (bVar3) {
      if (right->Type == IntegerNumber) {
        bVar3 = 0 < (long)(right->field_0).SubExpressions.storage_;
      }
      else if (right->Type == NaturalNumber) {
        bVar3 = (right->field_0).SubExpressions.storage_ != (QExpression *)0x0;
      }
      else {
        bVar3 = 0.0 < *(double *)&right->field_0;
      }
      goto LAB_001156d1;
    }
    uVar5 = 0;
    goto LAB_001156d4;
  case 3:
    bVar3 = isEqual(this,left,right);
    if (!bVar3) {
      return false;
    }
    break;
  case 4:
    bVar3 = isEqual(this,left,right);
    if (!bVar3) {
      return false;
    }
    *(byte *)&left->field_0 = *(byte *)&left->field_0 ^ 1;
    break;
  case 5:
    bVar3 = QExpression::operator>=(left,right);
    goto LAB_001156d1;
  case 6:
    bVar3 = QExpression::operator<=(left,right);
    goto LAB_001156d1;
  case 7:
    bVar3 = QExpression::operator>(left,right);
    goto LAB_001156d1;
  case 8:
    bVar3 = QExpression::operator<(left,right);
LAB_001156d1:
    uVar5 = (ulong)bVar3;
LAB_001156d4:
    *(ulong *)&left->field_0 = uVar5;
LAB_001156d7:
    left->Type = NaturalNumber;
    break;
  case 9:
    QExpression::operator|=(left,right);
    break;
  case 10:
    QExpression::operator&=(left,right);
    break;
  case 0xb:
    QExpression::operator+=(left,right);
    break;
  case 0xc:
    QExpression::operator-=(left,right);
    break;
  case 0xd:
    QExpression::operator*=(left,right);
    break;
  case 0xe:
    if ((right->Type == IntegerNumber) || (right->Type == NaturalNumber)) {
      bVar3 = (right->field_0).SubExpressions.storage_ != (QExpression *)0x0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (right->field_0).SubExpressions.storage_;
      uVar2 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar1,4);
      bVar3 = (bool)((byte)uVar2 & 1);
    }
    if (bVar3 == false) {
      return false;
    }
    QExpression::operator/=(left,right);
    break;
  case 0xf:
    pQVar4 = (QExpression *)QExpression::operator%(left,right);
    (left->field_0).SubExpressions.storage_ = pQVar4;
    left->Type = IntegerNumber;
    break;
  case 0x10:
    bVar3 = QExpression::operator^=(left,right);
    return bVar3;
  }
  return true;
}

Assistant:

bool evaluateExpression(QExpression &left, QExpression &right, const QOperation oper) const noexcept {
        switch (oper) {
            case QOperation::Exponent: { // ^
                return (left ^= right);
            }

            case QOperation::Remainder: { // %
                left.Value.Number.Integer = (left % right);
                left.Type                 = ExpressionType::IntegerNumber;
                break;
            }

            case QOperation::Multiplication: { // *
                left *= right;
                break;
            }

            case QOperation::Division: { // /
                if (right != 0ULL) {
                    left /= right;
                    break;
                }

                return false;
            }

            case QOperation::Addition: { // +
                left += right;
                break;
            }

            case QOperation::Subtraction: { // -
                left -= right;
                break;
            }

            case QOperation::BitwiseAnd: { // &
                left &= right;
                break;
            }

            case QOperation::BitwiseOr: { // |
                left |= right;
                break;
            }

            case QOperation::Less: { // <
                left.Value.Number.Natural = SizeT64(left < right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::LessOrEqual: { // <=
                left.Value.Number.Natural = SizeT64(left <= right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Greater: { // >
                left.Value.Number.Natural = SizeT64(left > right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::GreaterOrEqual: { // >=
                left.Value.Number.Natural = SizeT64(left >= right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::And: { // &&
                left.Value.Number.Natural = SizeT64((left > 0U) && (right > 0U));
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Or: { // ||
                left.Value.Number.Natural = SizeT64((left > 0U) || (right > 0U));
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Equal: { // ==
                if (isEqual(left, right)) {
                    break;
                }

                return false;
            }

            case QOperation::NotEqual: { // !=
                if (isEqual(left, right)) {
                    left.Value.Number.Natural = (left.Value.Number.Natural ^ 1ULL);
                    break;
                }

                return false;
            }

            default: {
                // It will not reach this.
            }
        }

        return true;
    }